

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O1

CloudNode * cloudMakeNode(CloudManager *dd,CloudVar v,CloudNode *t,CloudNode *e)

{
  CloudSign CVar1;
  CloudNode *pCVar2;
  CloudNode *pCVar3;
  CloudNode *pCVar4;
  int iVar5;
  CloudNode *pCVar6;
  
  pCVar2 = dd->tUnique;
  if (pCVar2 <= t) {
    if (t < pCVar2 + dd->nNodesAlloc) {
      if ((e < pCVar2) || (pCVar2 + dd->nNodesAlloc <= e)) {
        __assert_fail("(e) >= dd->tUnique && (e) < dd->tUnique+dd->nNodesAlloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                      ,0x120,
                      "CloudNode *cloudMakeNode(CloudManager *, CloudVar, CloudNode *, CloudNode *)"
                     );
      }
      if (((int)v < 0) || (dd->nVars <= (int)v)) {
        __assert_fail("((int)v) >= 0 && ((int)v) < dd->nVars",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                      ,0x122,
                      "CloudNode *cloudMakeNode(CloudManager *, CloudVar, CloudNode *, CloudNode *)"
                     );
      }
      if ((*(uint *)(((ulong)t & 0xfffffffffffffffe) + 4) <= v) ||
         (*(uint *)(((ulong)e & 0xfffffffffffffffe) + 4) <= v)) {
        __assert_fail("v < Cloud_V(t) && v < Cloud_V(e)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                      ,0x123,
                      "CloudNode *cloudMakeNode(CloudManager *, CloudVar, CloudNode *, CloudNode *)"
                     );
      }
      if (((ulong)t & 1) != 0) {
        __assert_fail("!Cloud_IsComplement(t)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                      ,0x124,
                      "CloudNode *cloudMakeNode(CloudManager *, CloudVar, CloudNode *, CloudNode *)"
                     );
      }
      if ((t != (CloudNode *)0x0) && (e != (CloudNode *)0x0)) {
        pCVar6 = pCVar2 + (((v * 0xc00005 + (int)t) * 0x40f1f9 + (int)e) * 0xb5051 >>
                          ((byte)dd->shiftUnique & 0x1f));
        CVar1 = dd->nSignCur;
        if (pCVar6->s == CVar1) {
          do {
            if (((pCVar6->v == v) && (pCVar6->t == t)) && (pCVar6->e == e)) {
              dd->nUniqueHits = dd->nUniqueHits + 1;
              return pCVar6;
            }
            pCVar4 = pCVar6 + 1;
            pCVar3 = pCVar6;
            if (((long)(pCVar6 + 1) - (long)pCVar2 >> 3) * -0x5555555555555555 -
                (long)dd->nNodesAlloc == 0) {
              pCVar4 = pCVar2 + 1;
              pCVar3 = pCVar2;
            }
            pCVar6 = pCVar4;
            dd->nUniqueSteps = dd->nUniqueSteps + 1;
          } while (pCVar3[1].s == CVar1);
        }
        dd->nUniqueMisses = dd->nUniqueMisses + 1;
        iVar5 = dd->nNodesCur + 1;
        dd->nNodesCur = iVar5;
        if (iVar5 == dd->nNodesLimit) {
          puts("Cloud needs restart!");
          pCVar6 = (CloudNode *)0x0;
        }
        else {
          pCVar6->s = CVar1;
          pCVar6->v = v;
          pCVar6->t = t;
          pCVar6->e = e;
        }
        return pCVar6;
      }
      __assert_fail("t && e",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                    ,0x127,
                    "CloudNode *cloudMakeNode(CloudManager *, CloudVar, CloudNode *, CloudNode *)");
    }
  }
  __assert_fail("(t) >= dd->tUnique && (t) < dd->tUnique+dd->nNodesAlloc",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                ,0x11f,
                "CloudNode *cloudMakeNode(CloudManager *, CloudVar, CloudNode *, CloudNode *)");
}

Assistant:

CloudNode * cloudMakeNode( CloudManager * dd, CloudVar v, CloudNode * t, CloudNode * e )
{
	CloudNode * entryUnique;

	CLOUD_ASSERT(t); 
	CLOUD_ASSERT(e);

	assert( ((int)v) >= 0 && ((int)v) < dd->nVars );  // the variable must be in the range
    assert( v < Cloud_V(t) && v < Cloud_V(e) );       // variable should be above in the order
	assert( !Cloud_IsComplement(t) );                 // the THEN edge must not be complemented

	// make sure we are not searching for the constant node
	assert( t && e );

	// get the unique entry
	entryUnique = dd->tUnique + cloudHashCudd3(v, t, e, dd->shiftUnique);
	while ( entryUnique->s == dd->nSignCur )
	{
		// compare the node
		if ( entryUnique->v == v && entryUnique->t == t && entryUnique->e == e )
		{ // the node is found
			dd->nUniqueHits++;
			return entryUnique;  // returns the node
		}
		// increment the hash value modulus the hash table size
		if ( ++entryUnique - dd->tUnique == dd->nNodesAlloc )
			entryUnique = dd->tUnique + 1;
		// increment the number of steps through the table
		dd->nUniqueSteps++;
	}
	dd->nUniqueMisses++;

	// check if the new node can be created
	if ( ++dd->nNodesCur == dd->nNodesLimit ) 
	{ // initiate the restart
		printf( "Cloud needs restart!\n" );
//		fflush( stdout );
//		exit(1);
		return NULL;
	}
	// create the node
	entryUnique->s   = dd->nSignCur;
	entryUnique->v   = v;
	entryUnique->t   = t;
	entryUnique->e   = e;
	return entryUnique;  // returns the node
}